

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.c
# Opt level: O3

int lgx_co_checkstack(lgx_co_t *co,uint stack_size)

{
  uint uVar1;
  uint uVar2;
  lgx_value_t *plVar3;
  uint uVar4;
  int iVar5;
  
  plVar3 = (co->stack).buf;
  uVar1 = (co->stack).base;
  if (plVar3[uVar1].type == T_FUNCTION) {
    uVar2 = uVar1 + stack_size + *(int *)&((plVar3[uVar1].v.arr)->table).head;
    uVar1 = (co->stack).size;
    iVar5 = 0;
    if (uVar1 <= uVar2) {
      do {
        uVar4 = uVar1;
        uVar1 = uVar4 * 2;
      } while (uVar4 <= uVar2);
      iVar5 = 1;
      if (uVar4 < 0x10001) {
        plVar3 = (lgx_value_t *)realloc(plVar3,(ulong)(uVar4 << 4));
        if (plVar3 != (lgx_value_t *)0x0) {
          uVar1 = (co->stack).size;
          iVar5 = 0;
          memset(plVar3 + uVar1,0,(ulong)(uVar4 - uVar1) << 4);
          (co->stack).buf = plVar3;
          (co->stack).size = uVar4;
        }
      }
    }
    return iVar5;
  }
  __assert_fail("check_type(&regs[0], T_FUNCTION)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/interpreter/coroutine.c"
                ,499,"int lgx_co_checkstack(lgx_co_t *, unsigned int)");
}

Assistant:

int lgx_co_checkstack(lgx_co_t *co, unsigned int stack_size) {
    lgx_co_stack_t *stack = &co->stack;
    lgx_value_t *regs = &stack->buf[stack->base];

    assert(check_type(&regs[0], T_FUNCTION));

    if (stack->base + regs[0].v.fun->stack_size + stack_size < stack->size) {
        return 0;
    }

    unsigned int size = stack->size;
    while (stack->base + regs[0].v.fun->stack_size + stack_size >= size) {
        size *= 2;
    }

    if (size > LGX_MAX_STACK_SIZE) {
        return 1;
    }

    lgx_value_t *s = (lgx_value_t *)xrealloc(stack->buf, size * sizeof(lgx_value_t));
    if (!s) {
        return 1;
    }
    // 初始化新空间
    memset(s + stack->size, 0, (size - stack->size) * sizeof(lgx_value_t));

    stack->buf = s;
    stack->size = size;

    return 0;
}